

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor.cpp
# Opt level: O0

Token __thiscall slang::parsing::Preprocessor::handleDirectives(Preprocessor *this,Token token)

{
  span<const_slang::parsing::Token,_18446744073709551615UL> tokens_00;
  SourceRange range;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_01;
  Token directive_00;
  Token directive_01;
  Token directive_02;
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  basic_string_view<char,_std::char_traits<char>_> __x_01;
  Token directive_03;
  Token directive_04;
  Token directive_05;
  Token directive_06;
  Token directive_07;
  Token directive_08;
  Token directive_09;
  span<const_slang::parsing::Trivia,_18446744073709551615UL> trivia_00;
  Token directive_10;
  Token directive_11;
  Token directive_12;
  Token directive_13;
  Token directive_14;
  Token directive_15;
  Token directive_16;
  Token directive_17;
  Token directive_18;
  Token directive_19;
  Token directive_20;
  Token directive_21;
  Token directive_22;
  bool bVar1;
  SyntaxKind SVar2;
  Info *in_RDX;
  EVP_PKEY_CTX *src;
  EVP_PKEY_CTX *src_00;
  EVP_PKEY_CTX *src_01;
  undefined8 in_RSI;
  long in_RDI;
  Token TVar3;
  Trivia TVar4;
  Trivia TVar5;
  Trivia TVar6;
  Trivia TVar7;
  Trivia TVar8;
  Trivia TVar9;
  Trivia TVar10;
  Trivia TVar11;
  span<const_slang::parsing::Trivia,_18446744073709551615UL> sVar12;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aVar13;
  type *skipped_1;
  type *directive_2;
  type *skipped;
  type *directive_1;
  type *extra;
  type *directive;
  Token savedLast;
  string_view raw;
  SmallVector<slang::parsing::Token,_2UL> tokens;
  SmallVector<slang::parsing::Trivia,_8UL> trivia;
  undefined7 in_stack_fffffffffffff618;
  TriviaKind in_stack_fffffffffffff61f;
  Info *in_stack_fffffffffffff620;
  SmallVectorBase<slang::parsing::Trivia> *pSVar14;
  undefined8 in_stack_fffffffffffff628;
  undefined4 in_stack_fffffffffffff630;
  DiagCode in_stack_fffffffffffff634;
  SourceLocation in_stack_fffffffffffff638;
  undefined4 in_stack_fffffffffffff640;
  DiagCode in_stack_fffffffffffff644;
  size_t in_stack_fffffffffffff648;
  Preprocessor *in_stack_fffffffffffff650;
  BumpAllocator *in_stack_fffffffffffff658;
  Preprocessor *in_stack_fffffffffffff660;
  undefined8 in_stack_fffffffffffff668;
  undefined8 uVar15;
  undefined8 in_stack_fffffffffffff670;
  Preprocessor *this_00;
  undefined7 in_stack_fffffffffffff678;
  undefined1 in_stack_fffffffffffff67f;
  Preprocessor *in_stack_fffffffffffff680;
  undefined7 in_stack_fffffffffffff688;
  undefined1 in_stack_fffffffffffff68f;
  Preprocessor *in_stack_fffffffffffff690;
  undefined8 in_stack_fffffffffffff698;
  undefined8 uVar16;
  undefined8 in_stack_fffffffffffff6a0;
  Preprocessor *in_stack_fffffffffffff6b0;
  undefined8 in_stack_fffffffffffff6b8;
  undefined8 uVar17;
  undefined8 in_stack_fffffffffffff6c0;
  Preprocessor *this_01;
  undefined8 in_stack_fffffffffffff6c8;
  undefined8 uVar18;
  undefined8 in_stack_fffffffffffff6d0;
  Preprocessor *in_stack_fffffffffffff6f0;
  undefined8 in_stack_fffffffffffff6f8;
  undefined8 uVar19;
  undefined8 in_stack_fffffffffffff700;
  undefined8 in_stack_fffffffffffff708;
  undefined8 uVar20;
  undefined8 in_stack_fffffffffffff710;
  Preprocessor *in_stack_fffffffffffff780;
  undefined8 in_stack_fffffffffffff788;
  undefined8 uVar21;
  undefined8 in_stack_fffffffffffff790;
  Preprocessor *in_stack_fffffffffffff800;
  Preprocessor *in_stack_fffffffffffff930;
  Token in_stack_fffffffffffff938;
  undefined6 local_670;
  undefined6 in_stack_fffffffffffff9b0;
  undefined2 in_stack_fffffffffffff9b6;
  undefined6 in_stack_fffffffffffff9b8;
  undefined2 in_stack_fffffffffffff9be;
  undefined6 in_stack_fffffffffffff9c0;
  undefined2 in_stack_fffffffffffff9c6;
  undefined6 local_548;
  undefined2 uStack_542;
  undefined6 local_540;
  undefined2 uStack_53a;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_538;
  undefined6 local_528;
  undefined2 local_522;
  undefined6 uStack_520;
  char local_518 [6];
  char acStack_512 [2];
  undefined1 local_510 [16];
  pointer pbStack_500;
  char local_4f8 [6];
  char local_4f2 [2];
  Token TStack_4f0;
  undefined1 local_4e0 [16];
  Info *pIStack_4d0;
  undefined6 local_4c8;
  undefined2 local_4c2;
  Token TStack_4c0;
  char local_4b0 [6];
  char acStack_4aa [2];
  undefined1 local_4a8 [16];
  char local_498 [6];
  char local_492 [2];
  char acStack_490 [8];
  undefined6 local_488;
  undefined2 uStack_482;
  undefined6 local_480;
  undefined2 uStack_47a;
  undefined1 local_478 [16];
  undefined6 local_468;
  undefined2 local_462;
  undefined6 uStack_460;
  char local_458 [6];
  char acStack_452 [2];
  char local_450 [6];
  char acStack_44a [2];
  undefined1 local_448 [16];
  char local_438 [6];
  char local_432 [2];
  char acStack_430 [8];
  char local_428 [6];
  undefined2 uStack_422;
  undefined1 local_420 [16];
  SourceLocation SStack_410;
  char local_408 [6];
  undefined2 local_402;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 aaStack_400 [2];
  undefined6 local_3f0;
  undefined2 uStack_3ea;
  undefined1 local_3e8 [24];
  undefined6 uStack_3d0;
  char local_3c8 [6];
  char acStack_3c2 [2];
  char local_3c0 [8];
  undefined1 local_3b8 [16];
  char local_3a8 [6];
  char local_3a2 [2];
  char acStack_3a0 [16];
  undefined1 local_390 [16];
  Info *pIStack_380;
  undefined6 local_378;
  undefined2 local_372;
  Token TStack_370;
  char local_360 [6];
  undefined2 uStack_35a;
  undefined1 local_358 [16];
  char local_348 [6];
  char local_342 [2];
  char acStack_340 [8];
  char local_338 [6];
  char acStack_332 [2];
  undefined6 local_330;
  undefined2 uStack_32a;
  undefined1 local_328 [16];
  char local_318 [6];
  char local_312 [2];
  undefined6 uStack_310;
  type *local_308;
  type *local_300;
  undefined1 local_2f8 [54];
  undefined2 uStack_2c2;
  undefined6 in_stack_fffffffffffffd40;
  undefined2 in_stack_fffffffffffffd46;
  undefined8 in_stack_fffffffffffffd48;
  SourceLocation in_stack_fffffffffffffd50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  directive_23;
  SmallVectorBase<slang::parsing::Token> local_f8;
  SmallVectorBase<slang::parsing::Trivia> local_c0 [4];
  undefined1 local_20 [16];
  Token local_10;
  
  local_20._0_8_ = in_RSI;
  local_20._8_8_ = in_RDX;
  SmallVector<slang::parsing::Trivia,_8UL>::SmallVector
            ((SmallVector<slang::parsing::Trivia,_8UL> *)0x26d24c);
  directive_23._8_8_ = in_stack_fffffffffffffd50;
  directive_23._M_allocated_capacity = in_stack_fffffffffffffd48;
  TVar4._8_8_ = in_stack_fffffffffffff788;
  TVar4.field_0.rawText.ptr = (char *)in_stack_fffffffffffff790;
  TVar6._8_8_ = in_stack_fffffffffffff708;
  TVar6.field_0.rawText.ptr = (char *)in_stack_fffffffffffff710;
  TVar7._8_8_ = in_stack_fffffffffffff6f8;
  TVar7.field_0.rawText.ptr = (char *)in_stack_fffffffffffff700;
  TVar8._8_8_ = in_stack_fffffffffffff6c8;
  TVar8.field_0.rawText.ptr = (char *)in_stack_fffffffffffff6d0;
  TVar9._8_8_ = in_stack_fffffffffffff6b8;
  TVar9.field_0.rawText.ptr = (char *)in_stack_fffffffffffff6c0;
  TVar10._8_8_ = in_stack_fffffffffffff698;
  TVar10.field_0.rawText.ptr = (char *)in_stack_fffffffffffff6a0;
  TVar11._8_8_ = in_stack_fffffffffffff668;
  TVar11.field_0.rawText.ptr = (char *)in_stack_fffffffffffff670;
  aVar13._8_8_ = in_stack_fffffffffffff620;
  aVar13._M_allocated_capacity = in_stack_fffffffffffff628;
  local_670 = in_stack_fffffffffffff9b0;
  while( true ) {
    if (local_20._0_2_ == Unknown) break;
    if (local_20._0_2_ == Directive) {
      TVar3 = std::exchange<slang::parsing::Token,slang::parsing::Token&>
                        (aVar13._8_8_,
                         (Token *)CONCAT17(in_stack_fffffffffffff61f,in_stack_fffffffffffff618));
      in_stack_fffffffffffff800 = (Preprocessor *)TVar3.info;
      SVar2 = Token::directiveKind(aVar13._8_8_);
      uVar21 = TVar4._8_8_;
      uVar20 = TVar6._8_8_;
      uVar19 = TVar7._8_8_;
      uVar18 = TVar8._8_8_;
      uVar17 = TVar9._8_8_;
      this_01 = TVar9.field_0._0_8_;
      uVar16 = TVar10._8_8_;
      uVar15 = TVar11._8_8_;
      this_00 = TVar11.field_0._0_8_;
      pSVar14 = aVar13._8_8_;
      if (SVar2 == BeginKeywordsDirective) {
        directive_12.rawLen._3_1_ = (bool)in_stack_fffffffffffff68f;
        directive_12._0_7_ = in_stack_fffffffffffff688;
        directive_12.info = (Info *)in_stack_fffffffffffff690;
        unique0x10007de9 =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              )local_20;
        TVar6 = handleBeginKeywordsDirective(in_stack_fffffffffffff680,directive_12);
        local_518 = TVar6.field_0._0_6_;
        acStack_512 = TVar6.field_0._6_2_;
        local_510._0_6_ = TVar6._8_6_;
        local_510._6_2_ = TVar6._14_2_;
        TStack_4f0._0_6_ = local_510._0_6_;
        local_4f8 = local_518;
        local_4f2 = acStack_512;
        SmallVectorBase<slang::parsing::Trivia>::push_back
                  (aVar13._8_8_,
                   (Trivia *)CONCAT17(in_stack_fffffffffffff61f,in_stack_fffffffffffff618));
      }
      else if (SVar2 == CellDefineDirective) {
        directive_00.info._0_4_ = in_stack_fffffffffffff640;
        directive_00._0_8_ = in_stack_fffffffffffff638;
        directive_00.info._4_4_ = in_stack_fffffffffffff644;
        TVar9 = handleCellDefineDirective
                          ((Preprocessor *)
                           CONCAT44(in_stack_fffffffffffff634,in_stack_fffffffffffff630),
                           directive_00);
        SmallVectorBase<slang::parsing::Trivia>::push_back
                  (aVar13._8_8_,
                   (Trivia *)CONCAT17(in_stack_fffffffffffff61f,in_stack_fffffffffffff618));
      }
      else if (SVar2 == DefaultDecayTimeDirective) {
        directive_18.info = TVar8.field_0._0_8_;
        directive_18.kind = (short)uVar18;
        directive_18._2_1_ = (char)((ulong)uVar18 >> 0x10);
        directive_18.numFlags.raw = (char)((ulong)uVar18 >> 0x18);
        directive_18.rawLen = (int)((ulong)uVar18 >> 0x20);
        TVar10 = handleDefaultDecayTimeDirective(this_01,directive_18);
        local_670 = TVar10._8_6_;
        SmallVectorBase<slang::parsing::Trivia>::push_back
                  (aVar13._8_8_,
                   (Trivia *)CONCAT17(in_stack_fffffffffffff61f,in_stack_fffffffffffff618));
      }
      else if (SVar2 == DefaultNetTypeDirective) {
        directive_19.info = (Info *)TVar7.field_0._0_8_;
        directive_19.kind = (short)uVar19;
        directive_19._2_1_ = (char)((ulong)uVar19 >> 0x10);
        directive_19.numFlags.raw = (char)((ulong)uVar19 >> 0x18);
        directive_19.rawLen = (int)((ulong)uVar19 >> 0x20);
        local_448 = local_20;
        TVar5 = handleDefaultNetTypeDirective(in_stack_fffffffffffff6f0,directive_19);
        local_458 = TVar5.field_0._0_6_;
        acStack_452 = TVar5.field_0._6_2_;
        local_450 = TVar5._8_6_;
        acStack_44a = TVar5._14_2_;
        acStack_430[0] = local_450[0];
        acStack_430[1] = local_450[1];
        acStack_430[2] = local_450[2];
        acStack_430[3] = local_450[3];
        acStack_430[4] = local_450[4];
        acStack_430[5] = local_450[5];
        local_438 = local_458;
        local_432 = acStack_452;
        SmallVectorBase<slang::parsing::Trivia>::push_back
                  (pSVar14,(Trivia *)CONCAT17(in_stack_fffffffffffff61f,in_stack_fffffffffffff618));
      }
      else if (SVar2 == DefaultTriregStrengthDirective) {
        directive_04.info = (Info *)in_stack_fffffffffffff650;
        directive_04.kind = (short)in_stack_fffffffffffff648;
        directive_04._2_1_ = (char)(in_stack_fffffffffffff648 >> 0x10);
        directive_04.numFlags.raw = (char)(in_stack_fffffffffffff648 >> 0x18);
        directive_04.rawLen = (int)(in_stack_fffffffffffff648 >> 0x20);
        TVar5 = handleDefaultTriregStrengthDirective
                          ((Preprocessor *)
                           CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640),
                           directive_04);
        in_stack_fffffffffffff690 = TVar5.field_0._0_8_;
        in_stack_fffffffffffff688 = TVar5._8_7_;
        in_stack_fffffffffffff68f = TVar5._15_1_;
        SmallVectorBase<slang::parsing::Trivia>::push_back
                  (pSVar14,(Trivia *)CONCAT17(in_stack_fffffffffffff61f,in_stack_fffffffffffff618));
      }
      else if (SVar2 == DefineDirective) {
        directive_22.rawLen._2_2_ = in_stack_fffffffffffff9be;
        directive_22._0_6_ = in_stack_fffffffffffff9b8;
        directive_22.info._0_6_ = in_stack_fffffffffffff9c0;
        directive_22.info._6_2_ = in_stack_fffffffffffff9c6;
        directive_23 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        )local_20;
        TVar5 = handleDefineDirective
                          ((Preprocessor *)CONCAT26(in_stack_fffffffffffff9b6,local_670),
                           directive_22);
        local_2f8._48_6_ = TVar5.field_0._0_6_;
        uStack_2c2 = TVar5.field_0._6_2_;
        in_stack_fffffffffffffd40 = TVar5._8_6_;
        in_stack_fffffffffffffd46 = TVar5._14_2_;
        SmallVectorBase<slang::parsing::Trivia>::push_back
                  (pSVar14,(Trivia *)CONCAT17(in_stack_fffffffffffff61f,in_stack_fffffffffffff618));
      }
      else if (SVar2 - DelayModeDistributedDirective < 4) {
LAB_0026e8ea:
        directive_02.info._0_4_ = in_stack_fffffffffffff640;
        directive_02._0_8_ = in_stack_fffffffffffff638;
        directive_02.info._4_4_ = in_stack_fffffffffffff644;
        TVar11 = createSimpleDirective
                           ((Preprocessor *)
                            CONCAT44(in_stack_fffffffffffff634,in_stack_fffffffffffff630),
                            directive_02);
        SmallVectorBase<slang::parsing::Trivia>::push_back
                  (pSVar14,(Trivia *)CONCAT17(in_stack_fffffffffffff61f,in_stack_fffffffffffff618));
      }
      else if (SVar2 == ElsIfDirective) {
        directive_08.info = (Info *)this_00;
        directive_08.kind = (short)uVar15;
        directive_08._2_1_ = (char)((ulong)uVar15 >> 0x10);
        directive_08.numFlags.raw = (char)((ulong)uVar15 >> 0x18);
        directive_08.rawLen = (int)((ulong)uVar15 >> 0x20);
        unique0x10007d69 =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              )local_20;
        TVar4 = handleElsIfDirective(in_stack_fffffffffffff660,directive_08);
        acStack_3a0._8_6_ = TVar4.field_0._0_6_;
        acStack_3a0._14_2_ = TVar4.field_0._6_2_;
        local_390._0_6_ = TVar4._8_6_;
        local_390._6_2_ = TVar4._14_2_;
        TStack_370._0_6_ = local_390._0_6_;
        local_378 = acStack_3a0._8_6_;
        local_372 = acStack_3a0._14_2_;
        SmallVectorBase<slang::parsing::Trivia>::push_back
                  (pSVar14,(Trivia *)CONCAT17(in_stack_fffffffffffff61f,in_stack_fffffffffffff618));
      }
      else if (SVar2 == ElseDirective) {
        directive_06.info = (Info *)in_stack_fffffffffffff660;
        directive_06._0_8_ = in_stack_fffffffffffff658;
        local_3b8 = local_20;
        TVar5 = handleElseDirective(in_stack_fffffffffffff650,directive_06);
        in_stack_fffffffffffff780 = TVar5.field_0._0_8_;
        local_3c8 = TVar5.field_0._0_6_;
        acStack_3c2 = TVar5.field_0._6_2_;
        local_3c0._0_6_ = TVar5._8_6_;
        local_3c0._6_2_ = TVar5._14_2_;
        acStack_3a0[0] = local_3c0[0];
        acStack_3a0[1] = local_3c0[1];
        acStack_3a0[2] = local_3c0[2];
        acStack_3a0[3] = local_3c0[3];
        acStack_3a0[4] = local_3c0[4];
        acStack_3a0[5] = local_3c0[5];
        local_3a8 = local_3c8;
        local_3a2 = acStack_3c2;
        SmallVectorBase<slang::parsing::Trivia>::push_back
                  (pSVar14,(Trivia *)CONCAT17(in_stack_fffffffffffff61f,in_stack_fffffffffffff618));
      }
      else if (SVar2 == EndCellDefineDirective) {
        directive_01.info._0_4_ = in_stack_fffffffffffff640;
        directive_01._0_8_ = in_stack_fffffffffffff638;
        directive_01.info._4_4_ = in_stack_fffffffffffff644;
        TVar5 = handleEndCellDefineDirective
                          ((Preprocessor *)
                           CONCAT44(in_stack_fffffffffffff634,in_stack_fffffffffffff630),
                           directive_01);
        in_stack_fffffffffffff6b0 = TVar5.field_0._0_8_;
        in_stack_fffffffffffff9b8 = TVar5.field_0._0_6_;
        in_stack_fffffffffffff9be = TVar5.field_0._6_2_;
        in_stack_fffffffffffff9c0 = TVar5._8_6_;
        in_stack_fffffffffffff9c6 = TVar5._14_2_;
        SmallVectorBase<slang::parsing::Trivia>::push_back
                  (pSVar14,(Trivia *)CONCAT17(in_stack_fffffffffffff61f,in_stack_fffffffffffff618));
      }
      else if (SVar2 == EndIfDirective) {
        directive_09.info = (Info *)this_00;
        directive_09.kind = (short)uVar15;
        directive_09._2_1_ = (char)((ulong)uVar15 >> 0x10);
        directive_09.numFlags.raw = (char)((ulong)uVar15 >> 0x18);
        directive_09.rawLen = (int)((ulong)uVar15 >> 0x20);
        local_3e8._0_16_ = local_20;
        TVar5 = handleEndIfDirective(in_stack_fffffffffffff660,directive_09);
        aaStack_400[1]._0_6_ = TVar5.field_0._0_6_;
        aaStack_400[1]._6_2_ = TVar5.field_0._6_2_;
        local_3f0 = TVar5._8_6_;
        uStack_3ea = TVar5._14_2_;
        uStack_3d0 = local_3f0;
        local_3e8._16_6_ = aaStack_400[1]._0_6_;
        local_3e8._22_2_ = aaStack_400[1]._6_2_;
        SmallVectorBase<slang::parsing::Trivia>::push_back
                  (pSVar14,(Trivia *)CONCAT17(in_stack_fffffffffffff61f,in_stack_fffffffffffff618));
      }
      else if (SVar2 == EndKeywordsDirective) {
        directive_10.rawLen._3_1_ = in_stack_fffffffffffff67f;
        directive_10._0_7_ = in_stack_fffffffffffff678;
        directive_10.info = (Info *)in_stack_fffffffffffff680;
        local_538 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     )local_20;
        TVar7 = handleEndKeywordsDirective(this_00,directive_10);
        local_548 = TVar7.field_0._0_6_;
        uStack_542 = TVar7.field_0._6_2_;
        local_540 = TVar7._8_6_;
        uStack_53a = TVar7._14_2_;
        uStack_520 = local_540;
        local_528 = local_548;
        local_522 = uStack_542;
        SmallVectorBase<slang::parsing::Trivia>::push_back
                  (pSVar14,(Trivia *)CONCAT17(in_stack_fffffffffffff61f,in_stack_fffffffffffff618));
      }
      else {
        if (SVar2 - EndProtectDirective < 2) goto LAB_0026e8ea;
        if (SVar2 == IfDefDirective) {
          directive_13.info = TVar10.field_0._0_8_;
          directive_13.kind = (short)uVar16;
          directive_13._2_1_ = (char)((ulong)uVar16 >> 0x10);
          directive_13.numFlags.raw = (char)((ulong)uVar16 >> 0x18);
          directive_13.rawLen = (int)((ulong)uVar16 >> 0x20);
          local_328 = local_20;
          TVar5 = handleIfDefDirective
                            (in_stack_fffffffffffff690,directive_13,(bool)in_stack_fffffffffffff68f)
          ;
          local_338 = TVar5.field_0._0_6_;
          acStack_332 = TVar5.field_0._6_2_;
          local_330 = TVar5._8_6_;
          uStack_32a = TVar5._14_2_;
          uStack_310 = local_330;
          local_318 = local_338;
          local_312 = acStack_332;
          SmallVectorBase<slang::parsing::Trivia>::push_back
                    (pSVar14,(Trivia *)CONCAT17(in_stack_fffffffffffff61f,in_stack_fffffffffffff618)
                    );
        }
        else if (SVar2 == IfNDefDirective) {
          directive_14.info = TVar10.field_0._0_8_;
          directive_14.kind = (short)uVar16;
          directive_14._2_1_ = (char)((ulong)uVar16 >> 0x10);
          directive_14.numFlags.raw = (char)((ulong)uVar16 >> 0x18);
          directive_14.rawLen = (int)((ulong)uVar16 >> 0x20);
          local_358 = local_20;
          TVar5 = handleIfDefDirective
                            (in_stack_fffffffffffff690,directive_14,(bool)in_stack_fffffffffffff68f)
          ;
          TStack_370.info._0_6_ = TVar5.field_0._0_6_;
          TStack_370.info._6_2_ = TVar5.field_0._6_2_;
          local_360 = TVar5._8_6_;
          uStack_35a = TVar5._14_2_;
          acStack_340[0] = local_360[0];
          acStack_340[1] = local_360[1];
          acStack_340[2] = local_360[2];
          acStack_340[3] = local_360[3];
          acStack_340[4] = local_360[4];
          acStack_340[5] = local_360[5];
          local_348 = (char  [6])TStack_370.info._0_6_;
          local_342 = (char  [2])TStack_370.info._6_2_;
          SmallVectorBase<slang::parsing::Trivia>::push_back
                    (pSVar14,(Trivia *)CONCAT17(in_stack_fffffffffffff61f,in_stack_fffffffffffff618)
                    );
        }
        else if (SVar2 == IncludeDirective) {
          handleIncludeDirective
                    ((Preprocessor *)CONCAT26(in_stack_fffffffffffffd46,in_stack_fffffffffffffd40),
                     (Token)directive_23);
          SmallVectorBase<slang::parsing::Trivia>::push_back
                    (pSVar14,(Trivia *)CONCAT17(in_stack_fffffffffffff61f,in_stack_fffffffffffff618)
                    );
        }
        else if (SVar2 == LineDirective) {
          directive_20.info = TVar6.field_0._0_8_;
          directive_20.kind = (short)uVar20;
          directive_20._2_1_ = (char)((ulong)uVar20 >> 0x10);
          directive_20.numFlags.raw = (char)((ulong)uVar20 >> 0x18);
          directive_20.rawLen = (int)((ulong)uVar20 >> 0x20);
          local_478 = local_20;
          TVar5 = handleLineDirective(TVar7.field_0._0_8_,directive_20);
          local_488 = TVar5.field_0._0_6_;
          uStack_482 = TVar5.field_0._6_2_;
          local_480 = TVar5._8_6_;
          uStack_47a = TVar5._14_2_;
          uStack_460 = local_480;
          local_468 = local_488;
          local_462 = uStack_482;
          SmallVectorBase<slang::parsing::Trivia>::push_back
                    (pSVar14,(Trivia *)CONCAT17(in_stack_fffffffffffff61f,in_stack_fffffffffffff618)
                    );
        }
        else if (SVar2 == MacroUsage) {
          directive_11.rawLen._3_1_ = (bool)in_stack_fffffffffffff68f;
          directive_11._0_7_ = in_stack_fffffffffffff688;
          directive_11.info = (Info *)in_stack_fffffffffffff690;
          local_2f8._0_16_ = local_20;
          handleMacroUsage(in_stack_fffffffffffff680,directive_11);
          local_300 = std::get<0ul,slang::parsing::Trivia,slang::parsing::Trivia>
                                ((pair<slang::parsing::Trivia,_slang::parsing::Trivia> *)0x26dc1e);
          local_308 = std::get<1ul,slang::parsing::Trivia,slang::parsing::Trivia>
                                ((pair<slang::parsing::Trivia,_slang::parsing::Trivia> *)0x26dc33);
          SmallVectorBase<slang::parsing::Trivia>::push_back
                    (aVar13._8_8_,
                     (Trivia *)CONCAT17(in_stack_fffffffffffff61f,in_stack_fffffffffffff618));
          bVar1 = Trivia::operator_cast_to_bool((Trivia *)0x26dc5f);
          if (bVar1) {
            SmallVectorBase<slang::parsing::Trivia>::push_back
                      (aVar13._8_8_,
                       (Trivia *)CONCAT17(in_stack_fffffffffffff61f,in_stack_fffffffffffff618));
          }
        }
        else if (SVar2 == NoUnconnectedDriveDirective) {
          directive_07.info = (Info *)in_stack_fffffffffffff660;
          directive_07._0_8_ = in_stack_fffffffffffff658;
          TVar8 = handleNoUnconnectedDriveDirective(in_stack_fffffffffffff650,directive_07);
          SmallVectorBase<slang::parsing::Trivia>::push_back
                    (pSVar14,(Trivia *)CONCAT17(in_stack_fffffffffffff61f,in_stack_fffffffffffff618)
                    );
        }
        else if (SVar2 == PragmaDirective) {
          handlePragmaDirective(in_stack_fffffffffffff930,in_stack_fffffffffffff938);
          in_stack_fffffffffffff6f0 = (Preprocessor *)&stack0xfffffffffffffa98;
          std::get<0ul,slang::parsing::Trivia,slang::parsing::Trivia>
                    ((pair<slang::parsing::Trivia,_slang::parsing::Trivia> *)0x26e42a);
          std::get<1ul,slang::parsing::Trivia,slang::parsing::Trivia>
                    ((pair<slang::parsing::Trivia,_slang::parsing::Trivia> *)0x26e43f);
          SmallVectorBase<slang::parsing::Trivia>::push_back
                    (aVar13._8_8_,
                     (Trivia *)CONCAT17(in_stack_fffffffffffff61f,in_stack_fffffffffffff618));
          pSVar14 = aVar13._8_8_;
          bVar1 = Trivia::operator_cast_to_bool((Trivia *)0x26e46b);
          if (bVar1) {
            SmallVectorBase<slang::parsing::Trivia>::push_back
                      (pSVar14,(Trivia *)
                               CONCAT17(in_stack_fffffffffffff61f,in_stack_fffffffffffff618));
          }
        }
        else {
          if (SVar2 == ProtectDirective) goto LAB_0026e8ea;
          if (SVar2 == ProtectedDirective) {
            directive_21.info = TVar4.field_0._0_8_;
            directive_21.kind = (short)uVar21;
            directive_21._2_1_ = (char)((ulong)uVar21 >> 0x10);
            directive_21.numFlags.raw = (char)((ulong)uVar21 >> 0x18);
            directive_21.rawLen = (int)((ulong)uVar21 >> 0x20);
            in_stack_fffffffffffff930 = (Preprocessor *)local_20._8_8_;
            handleProtectedDirective(in_stack_fffffffffffff780,directive_21);
            in_stack_fffffffffffff680 = (Preprocessor *)&stack0xfffffffffffff938;
            std::get<0ul,slang::parsing::Trivia,slang::parsing::Trivia>
                      ((pair<slang::parsing::Trivia,_slang::parsing::Trivia> *)0x26e87e);
            std::get<1ul,slang::parsing::Trivia,slang::parsing::Trivia>
                      ((pair<slang::parsing::Trivia,_slang::parsing::Trivia> *)0x26e890);
            pSVar14 = aVar13._8_8_;
            SmallVectorBase<slang::parsing::Trivia>::push_back
                      (pSVar14,(Trivia *)
                               CONCAT17(in_stack_fffffffffffff61f,in_stack_fffffffffffff618));
            in_stack_fffffffffffff67f = Trivia::operator_cast_to_bool((Trivia *)0x26e8bc);
            if ((bool)in_stack_fffffffffffff67f) {
              SmallVectorBase<slang::parsing::Trivia>::push_back
                        (pSVar14,(Trivia *)
                                 CONCAT17(in_stack_fffffffffffff61f,in_stack_fffffffffffff618));
            }
          }
          else if (SVar2 == ResetAllDirective) {
            directive_05.info = (Info *)in_stack_fffffffffffff660;
            directive_05._0_8_ = in_stack_fffffffffffff658;
            handleResetAllDirective(in_stack_fffffffffffff650,directive_05);
            SmallVectorBase<slang::parsing::Trivia>::push_back
                      (pSVar14,(Trivia *)
                               CONCAT17(in_stack_fffffffffffff61f,in_stack_fffffffffffff618));
          }
          else if (SVar2 == TimeScaleDirective) {
            directive_15.info = (Info *)this_01;
            directive_15.kind = (short)uVar17;
            directive_15._2_1_ = (char)((ulong)uVar17 >> 0x10);
            directive_15.numFlags.raw = (char)((ulong)uVar17 >> 0x18);
            directive_15.rawLen = (int)((ulong)uVar17 >> 0x20);
            unique0x10007d99 =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  )local_20;
            TVar5 = handleTimeScaleDirective(in_stack_fffffffffffff6b0,directive_15);
            local_428 = TVar5.field_0._0_6_;
            uStack_422 = TVar5.field_0._6_2_;
            local_420._0_6_ = TVar5._8_6_;
            local_420._6_2_ = TVar5._14_2_;
            aaStack_400[0].val._0_6_ = local_420._0_6_;
            local_408 = local_428;
            local_402 = uStack_422;
            SmallVectorBase<slang::parsing::Trivia>::push_back
                      (pSVar14,(Trivia *)
                               CONCAT17(in_stack_fffffffffffff61f,in_stack_fffffffffffff618));
          }
          else if (SVar2 == UnconnectedDriveDirective) {
            directive_16.info = (Info *)this_01;
            directive_16.kind = (short)uVar17;
            directive_16._2_1_ = (char)((ulong)uVar17 >> 0x10);
            directive_16.numFlags.raw = (char)((ulong)uVar17 >> 0x18);
            directive_16.rawLen = (int)((ulong)uVar17 >> 0x20);
            handleUnconnectedDriveDirective(in_stack_fffffffffffff6b0,directive_16);
            SmallVectorBase<slang::parsing::Trivia>::push_back
                      (pSVar14,(Trivia *)
                               CONCAT17(in_stack_fffffffffffff61f,in_stack_fffffffffffff618));
          }
          else if (SVar2 == UndefDirective) {
            directive_17.info = TVar8.field_0._0_8_;
            directive_17.kind = (short)uVar18;
            directive_17._2_1_ = (char)((ulong)uVar18 >> 0x10);
            directive_17.numFlags.raw = (char)((ulong)uVar18 >> 0x18);
            directive_17.rawLen = (int)((ulong)uVar18 >> 0x20);
            local_4a8 = local_20;
            TVar5 = handleUndefDirective(this_01,directive_17);
            TStack_4c0.info._0_6_ = TVar5.field_0._0_6_;
            TStack_4c0.info._6_2_ = TVar5.field_0._6_2_;
            local_4b0 = TVar5._8_6_;
            acStack_4aa = TVar5._14_2_;
            acStack_490[0] = local_4b0[0];
            acStack_490[1] = local_4b0[1];
            acStack_490[2] = local_4b0[2];
            acStack_490[3] = local_4b0[3];
            acStack_490[4] = local_4b0[4];
            acStack_490[5] = local_4b0[5];
            local_498 = (char  [6])TStack_4c0.info._0_6_;
            local_492 = (char  [2])TStack_4c0.info._6_2_;
            SmallVectorBase<slang::parsing::Trivia>::push_back
                      (pSVar14,(Trivia *)
                               CONCAT17(in_stack_fffffffffffff61f,in_stack_fffffffffffff618));
          }
          else {
            directive_03.info = (Info *)in_stack_fffffffffffff650;
            directive_03.kind = (short)in_stack_fffffffffffff648;
            directive_03._2_1_ = (char)(in_stack_fffffffffffff648 >> 0x10);
            directive_03.numFlags.raw = (char)(in_stack_fffffffffffff648 >> 0x18);
            directive_03.rawLen = (int)(in_stack_fffffffffffff648 >> 0x20);
            unique0x10007dd9 =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  )local_20;
            TVar5 = handleUndefineAllDirective
                              ((Preprocessor *)
                               CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640),
                               directive_03);
            TStack_4f0.info._0_6_ = TVar5.field_0._0_6_;
            TStack_4f0.info._6_2_ = TVar5.field_0._6_2_;
            local_4e0._0_6_ = TVar5._8_6_;
            local_4e0._6_2_ = TVar5._14_2_;
            TStack_4c0._0_6_ = local_4e0._0_6_;
            local_4c8 = TStack_4f0.info._0_6_;
            local_4c2 = TStack_4f0.info._6_2_;
            SmallVectorBase<slang::parsing::Trivia>::push_back
                      (pSVar14,(Trivia *)
                               CONCAT17(in_stack_fffffffffffff61f,in_stack_fffffffffffff618));
          }
        }
      }
      *(Token *)(in_RDI + 0x1e8) = TVar3;
    }
    else {
      if ((3 < (ushort)(local_20._0_2_ - MacroQuote)) && (local_20._0_2_ != LineContinuation)) {
        sVar12 = Token::trivia((Token *)CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640
                                                ));
        SmallVectorBase<slang::parsing::Trivia>::
        append_range<std::span<const_slang::parsing::Trivia,_18446744073709551615UL>_>
                  ((SmallVectorBase<slang::parsing::Trivia> *)
                   CONCAT44(in_stack_fffffffffffff634,in_stack_fffffffffffff630),
                   (span<const_slang::parsing::Trivia,_18446744073709551615UL> *)
                   aVar13._M_allocated_capacity);
        SmallVectorBase<slang::parsing::Trivia>::copy
                  (local_c0,*(EVP_PKEY_CTX **)(in_RDI + 8),src_01);
        std::span<const_slang::parsing::Trivia,_18446744073709551615UL>::
        span<slang::parsing::Trivia,_18446744073709551615UL>
                  ((span<const_slang::parsing::Trivia,_18446744073709551615UL> *)
                   CONCAT44(in_stack_fffffffffffff634,in_stack_fffffffffffff630),
                   (span<slang::parsing::Trivia,_18446744073709551615UL> *)
                   aVar13._M_allocated_capacity);
        trivia_00._M_extent._M_extent_value = TVar11.field_0._0_8_;
        trivia_00._M_ptr = TVar11._8_8_;
        local_10 = Token::withTrivia((Token *)sVar12._M_ptr,
                                     (BumpAllocator *)
                                     sVar12._M_extent._M_extent_value._M_extent_value,trivia_00);
        goto LAB_0026eaf1;
      }
      SmallVector<slang::parsing::Token,_2UL>::SmallVector
                ((SmallVector<slang::parsing::Token,_2UL> *)0x26d2c6);
      SmallVectorBase<slang::parsing::Token>::push_back
                (aVar13._8_8_,(Token *)CONCAT17(in_stack_fffffffffffff61f,in_stack_fffffffffffff618)
                );
      SmallVectorBase<slang::parsing::Token>::copy(&local_f8,*(EVP_PKEY_CTX **)(in_RDI + 8),src);
      std::span<const_slang::parsing::Token,_18446744073709551615UL>::
      span<slang::parsing::Token,_18446744073709551615UL>
                ((span<const_slang::parsing::Token,_18446744073709551615UL> *)
                 CONCAT44(in_stack_fffffffffffff634,in_stack_fffffffffffff630),
                 (span<slang::parsing::Token,_18446744073709551615UL> *)aVar13._M_allocated_capacity
                );
      tokens_00._M_extent._M_extent_value._0_4_ = in_stack_fffffffffffff630;
      tokens_00._M_ptr = (pointer)aVar13._M_allocated_capacity;
      tokens_00._M_extent._M_extent_value._4_4_ = in_stack_fffffffffffff634;
      Trivia::Trivia(aVar13._8_8_,in_stack_fffffffffffff61f,tokens_00);
      SmallVectorBase<slang::parsing::Trivia>::push_back
                (aVar13._8_8_,
                 (Trivia *)CONCAT17(in_stack_fffffffffffff61f,in_stack_fffffffffffff618));
      Token::range((Token *)CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640));
      range.startLoc._4_2_ = in_stack_fffffffffffff634.subsystem;
      range.startLoc._6_2_ = in_stack_fffffffffffff634.code;
      range.startLoc._0_4_ = in_stack_fffffffffffff630;
      range.endLoc = in_stack_fffffffffffff638;
      addDiag((Preprocessor *)aVar13._M_allocated_capacity,in_stack_fffffffffffff644,range);
      SmallVector<slang::parsing::Token,_2UL>::~SmallVector
                ((SmallVector<slang::parsing::Token,_2UL> *)0x26d3f5);
    }
    aVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              )nextRaw(in_stack_fffffffffffff800);
    local_20 = (undefined1  [16])aVar13;
  }
  Token::rawText((Token *)CONCAT44(in_stack_fffffffffffff634,in_stack_fffffffffffff630));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)
             CONCAT44(in_stack_fffffffffffff634,in_stack_fffffffffffff630),
             (char *)aVar13._M_allocated_capacity);
  __x._M_str = (char *)in_stack_fffffffffffff650;
  __x._M_len = in_stack_fffffffffffff648;
  __y._M_str._0_4_ = in_stack_fffffffffffff640;
  __y._M_len = (size_t)in_stack_fffffffffffff638;
  __y._M_str._4_4_ = in_stack_fffffffffffff644;
  bVar1 = std::operator==(__x,__y);
  if (!bVar1) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT44(in_stack_fffffffffffff634,in_stack_fffffffffffff630),
               (char *)aVar13._M_allocated_capacity);
    __x_00._M_str = (char *)in_stack_fffffffffffff650;
    __x_00._M_len = in_stack_fffffffffffff648;
    __y_00._M_str._0_4_ = in_stack_fffffffffffff640;
    __y_00._M_len = (size_t)in_stack_fffffffffffff638;
    __y_00._M_str._4_4_ = in_stack_fffffffffffff644;
    bVar1 = std::operator==(__x_00,__y_00);
    if (!bVar1) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)
                 CONCAT44(in_stack_fffffffffffff634,in_stack_fffffffffffff630),
                 (char *)aVar13._M_allocated_capacity);
      __x_01._M_str = (char *)in_stack_fffffffffffff650;
      __x_01._M_len = in_stack_fffffffffffff648;
      __y_01._M_str._0_4_ = in_stack_fffffffffffff640;
      __y_01._M_len = (size_t)in_stack_fffffffffffff638;
      __y_01._M_str._4_4_ = in_stack_fffffffffffff644;
      bVar1 = std::operator==(__x_01,__y_01);
      if (bVar1) {
        Token::location((Token *)local_20);
        addDiag(aVar13._8_8_,in_stack_fffffffffffff634,(SourceLocation)aVar13._M_allocated_capacity)
        ;
      }
      goto LAB_0026d66b;
    }
  }
  Token::location((Token *)local_20);
  SourceLocation::operator+<int>((SourceLocation *)aVar13._M_allocated_capacity,aVar13._12_4_);
  addDiag(aVar13._8_8_,in_stack_fffffffffffff634,(SourceLocation)aVar13._M_allocated_capacity);
LAB_0026d66b:
  Token::trivia((Token *)CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640));
  SmallVectorBase<slang::parsing::Trivia>::
  append_range<std::span<const_slang::parsing::Trivia,_18446744073709551615UL>_>
            ((SmallVectorBase<slang::parsing::Trivia> *)
             CONCAT44(in_stack_fffffffffffff634,in_stack_fffffffffffff630),
             (span<const_slang::parsing::Trivia,_18446744073709551615UL> *)
             aVar13._M_allocated_capacity);
  SmallVectorBase<slang::parsing::Trivia>::copy(local_c0,*(EVP_PKEY_CTX **)(in_RDI + 8),src_00);
  std::span<const_slang::parsing::Trivia,_18446744073709551615UL>::
  span<slang::parsing::Trivia,_18446744073709551615UL>
            ((span<const_slang::parsing::Trivia,_18446744073709551615UL> *)
             CONCAT44(in_stack_fffffffffffff634,in_stack_fffffffffffff630),
             (span<slang::parsing::Trivia,_18446744073709551615UL> *)aVar13._M_allocated_capacity);
  sVar12._M_extent._M_extent_value = TVar11.field_0._0_8_;
  sVar12._M_ptr = TVar11._8_8_;
  local_10 = Token::withTrivia((Token *)in_stack_fffffffffffff660,in_stack_fffffffffffff658,sVar12);
LAB_0026eaf1:
  SmallVector<slang::parsing::Trivia,_8UL>::~SmallVector
            ((SmallVector<slang::parsing::Trivia,_8UL> *)0x26eafe);
  return local_10;
}

Assistant:

Token Preprocessor::handleDirectives(Token token) {
    // burn through any preprocessor directives we find and convert them to trivia
    SmallVector<Trivia, 8> trivia;
    while (true) {
        switch (token.kind) {
            case TokenKind::MacroQuote:
            case TokenKind::MacroTripleQuote:
            case TokenKind::MacroEscapedQuote:
            case TokenKind::MacroPaste:
            case TokenKind::LineContinuation: {
                SmallVector<Token> tokens;
                tokens.push_back(token);
                trivia.push_back(Trivia(TriviaKind::SkippedTokens, tokens.copy(alloc)));
                addDiag(diag::MacroOpsOutsideDefinition, token.range());
                break;
            }
            case TokenKind::Unknown: {
                // This is an error in the lexer. See if we should issue any more
                // specific diagnostics here (that were deferred until we know we're
                // not inside a macro) and then return the token.
                auto raw = token.rawText();
                if (raw == "\\" || raw == "`\\")
                    addDiag(diag::EscapedWhitespace, token.location() + 1);
                else if (raw == "`")
                    addDiag(diag::MisplacedDirectiveChar, token.location());

                trivia.append_range(token.trivia());
                return token.withTrivia(alloc, trivia.copy(alloc));
            }
            case TokenKind::Directive: {
                auto savedLast = std::exchange(lastConsumed, token);
                switch (token.directiveKind()) {
                    case SyntaxKind::IncludeDirective:
                        trivia.push_back(handleIncludeDirective(token));
                        break;
                    case SyntaxKind::ResetAllDirective:
                        trivia.push_back(handleResetAllDirective(token));
                        break;
                    case SyntaxKind::DefineDirective:
                        trivia.push_back(handleDefineDirective(token));
                        break;
                    case SyntaxKind::MacroUsage: {
                        auto [directive, extra] = handleMacroUsage(token);
                        trivia.push_back(directive);
                        if (extra)
                            trivia.push_back(extra);
                        break;
                    }
                    case SyntaxKind::IfDefDirective:
                        trivia.push_back(handleIfDefDirective(token, false));
                        break;
                    case SyntaxKind::IfNDefDirective:
                        trivia.push_back(handleIfDefDirective(token, true));
                        break;
                    case SyntaxKind::ElsIfDirective:
                        trivia.push_back(handleElsIfDirective(token));
                        break;
                    case SyntaxKind::ElseDirective:
                        trivia.push_back(handleElseDirective(token));
                        break;
                    case SyntaxKind::EndIfDirective:
                        trivia.push_back(handleEndIfDirective(token));
                        break;
                    case SyntaxKind::TimeScaleDirective:
                        trivia.push_back(handleTimeScaleDirective(token));
                        break;
                    case SyntaxKind::DefaultNetTypeDirective:
                        trivia.push_back(handleDefaultNetTypeDirective(token));
                        break;
                    case SyntaxKind::LineDirective:
                        trivia.push_back(handleLineDirective(token));
                        break;
                    case SyntaxKind::UndefDirective:
                        trivia.push_back(handleUndefDirective(token));
                        break;
                    case SyntaxKind::UndefineAllDirective:
                        trivia.push_back(handleUndefineAllDirective(token));
                        break;
                    case SyntaxKind::BeginKeywordsDirective:
                        trivia.push_back(handleBeginKeywordsDirective(token));
                        break;
                    case SyntaxKind::EndKeywordsDirective:
                        trivia.push_back(handleEndKeywordsDirective(token));
                        break;
                    case SyntaxKind::PragmaDirective: {
                        auto [directive, skipped] = handlePragmaDirective(token);
                        trivia.push_back(directive);
                        if (skipped)
                            trivia.push_back(skipped);
                        break;
                    }
                    case SyntaxKind::UnconnectedDriveDirective:
                        trivia.push_back(handleUnconnectedDriveDirective(token));
                        break;
                    case SyntaxKind::NoUnconnectedDriveDirective:
                        trivia.push_back(handleNoUnconnectedDriveDirective(token));
                        break;
                    case SyntaxKind::CellDefineDirective:
                        trivia.push_back(handleCellDefineDirective(token));
                        break;
                    case SyntaxKind::EndCellDefineDirective:
                        trivia.push_back(handleEndCellDefineDirective(token));
                        break;
                    case SyntaxKind::DefaultDecayTimeDirective:
                        trivia.push_back(handleDefaultDecayTimeDirective(token));
                        break;
                    case SyntaxKind::DefaultTriregStrengthDirective:
                        trivia.push_back(handleDefaultTriregStrengthDirective(token));
                        break;
                    case SyntaxKind::ProtectedDirective: {
                        auto [directive, skipped] = handleProtectedDirective(token);
                        trivia.push_back(directive);
                        if (skipped)
                            trivia.push_back(skipped);
                        break;
                    }
                    case SyntaxKind::DelayModeDistributedDirective:
                    case SyntaxKind::DelayModePathDirective:
                    case SyntaxKind::DelayModeUnitDirective:
                    case SyntaxKind::DelayModeZeroDirective:
                    case SyntaxKind::ProtectDirective:
                    case SyntaxKind::EndProtectDirective:
                    case SyntaxKind::EndProtectedDirective:
                        // we don't do anything with these directives currently
                        trivia.push_back(createSimpleDirective(token));
                        break;
                    default:
                        SLANG_UNREACHABLE;
                }
                lastConsumed = savedLast;
                break;
            }
            default:
                trivia.append_range(token.trivia());
                return token.withTrivia(alloc, trivia.copy(alloc));
        }

        token = nextRaw();
    }
}